

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

void __thiscall
helics::NetworkCommsInterface::setFlag(NetworkCommsInterface *this,string_view flag,bool val)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  byte in_CL;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  CommsInterface *unaff_retaddr;
  string_view in_stack_00000008;
  CommsInterface *in_stack_ffffffffffffff90;
  CommsInterface *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  size_t sVar2;
  undefined1 val_00;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  __x._M_str = in_stack_ffffffffffffffc0;
  __x._M_len = in_stack_ffffffffffffffb8;
  __y._M_str = in_stack_ffffffffffffffb0;
  __y._M_len = in_stack_ffffffffffffffa8;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    bVar1 = CommsInterface::propertyLock(in_stack_ffffffffffffff98);
    if (bVar1) {
      *(byte *)(in_RDI + 0x419) = in_CL & 1;
      CommsInterface::propertyUnLock(in_stack_ffffffffffffff90);
    }
  }
  else {
    sVar2 = in_RDX;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    val_00 = (undefined1)(sVar2 >> 0x38);
    __x_00._M_str = in_stack_ffffffffffffffc0;
    __x_00._M_len = in_RDX;
    __y_00._M_str = in_RSI;
    __y_00._M_len = in_stack_ffffffffffffffa8;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      bVar1 = CommsInterface::propertyLock(in_stack_ffffffffffffff98);
      if (bVar1) {
        *(byte *)(in_RDI + 0x41b) = in_CL & 1;
        CommsInterface::propertyUnLock(in_stack_ffffffffffffff90);
      }
    }
    else {
      CommsInterface::setFlag(unaff_retaddr,in_stack_00000008,(bool)val_00);
    }
  }
  return;
}

Assistant:

void NetworkCommsInterface::setFlag(std::string_view flag, bool val)
{
    if (flag == "os_port") {
        if (propertyLock()) {
            useOsPortAllocation = val;
            propertyUnLock();
        }
    } else if (flag == "noack_connect") {
        if (propertyLock()) {
            noAckConnection = val;
            propertyUnLock();
        }
    } else {
        CommsInterface::setFlag(flag, val);
    }
}